

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::
HandleConstResources<Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__0,Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__1,Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__2,Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__3>
          (ShaderVariableManagerGL *this,anon_class_32_4_f73c7e20 HandleUB,
          anon_class_32_4_f73c7e20 HandleTexture,anon_class_32_4_f73c7e20 HandleImage,
          anon_class_32_4_f73c7e20 HandleStorageBuffer)

{
  bool bVar1;
  Uint32 UVar2;
  UniformBuffBindInfo *ub_00;
  TextureBindInfo *tex;
  ImageBindInfo *img;
  StorageBufferBindInfo *ssbo;
  uint local_20;
  uint local_1c;
  Uint32 s_1;
  Uint32 i;
  Uint32 s;
  Uint32 ub;
  ShaderVariableManagerGL *this_local;
  
  for (i = 0; UVar2 = GetNumResources<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>(this),
      i < UVar2; i = i + 1) {
    ub_00 = GetConstResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>(this,i);
    bVar1 = CheckResources::anon_class_32_4_f73c7e20::operator()(&HandleUB,ub_00);
    if (!bVar1) {
      return;
    }
  }
  for (s_1 = 0; UVar2 = GetNumResources<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this),
      s_1 < UVar2; s_1 = s_1 + 1) {
    tex = GetConstResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,s_1);
    bVar1 = CheckResources::anon_class_32_4_f73c7e20::operator()(&HandleTexture,tex);
    if (!bVar1) {
      return;
    }
  }
  for (local_1c = 0; UVar2 = GetNumResources<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this)
      , local_1c < UVar2; local_1c = local_1c + 1) {
    img = GetConstResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this,local_1c);
    bVar1 = CheckResources::anon_class_32_4_f73c7e20::operator()(&HandleImage,img);
    if (!bVar1) {
      return;
    }
  }
  local_20 = 0;
  while( true ) {
    UVar2 = GetNumResources<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>(this);
    if (UVar2 <= local_20) {
      return;
    }
    ssbo = GetConstResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>(this,local_20)
    ;
    bVar1 = CheckResources::anon_class_32_4_f73c7e20::operator()(&HandleStorageBuffer,ssbo);
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void HandleConstResources(THandleUB            HandleUB,
                              THandleTexture       HandleTexture,
                              THandleImage         HandleImage,
                              THandleStorageBuffer HandleStorageBuffer) const
    {
        for (Uint32 ub = 0; ub < GetNumResources<UniformBuffBindInfo>(); ++ub)
            if (!HandleUB(GetConstResource<UniformBuffBindInfo>(ub)))
                return;

        for (Uint32 s = 0; s < GetNumResources<TextureBindInfo>(); ++s)
            if (!HandleTexture(GetConstResource<TextureBindInfo>(s)))
                return;

        for (Uint32 i = 0; i < GetNumResources<ImageBindInfo>(); ++i)
            if (!HandleImage(GetConstResource<ImageBindInfo>(i)))
                return;

        for (Uint32 s = 0; s < GetNumResources<StorageBufferBindInfo>(); ++s)
            if (!HandleStorageBuffer(GetConstResource<StorageBufferBindInfo>(s)))
                return;
    }